

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNClassicalGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm,realtype *stemp,
                  N_Vector *vtemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector p_Var4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  realtype rVar8;
  double dVar9;
  realtype rVar10;
  double dVar11;
  
  uVar5 = (ulong)(uint)p;
  if (k < p) {
    uVar5 = (ulong)(uint)k;
  }
  uVar7 = 0;
  if (0 < k - p) {
    uVar7 = (ulong)(uint)(k - p);
  }
  iVar3 = (int)uVar5;
  iVar1 = N_VDotProdMulti(iVar3 + 1,v[k],v + uVar7,stemp);
  if (iVar1 != 0) {
    return -1;
  }
  dVar9 = stemp[iVar3];
  dVar11 = 0.0;
  if (0.0 < dVar9) {
    if (dVar9 < 0.0) {
      dVar11 = sqrt(dVar9);
    }
    else {
      dVar11 = SQRT(dVar9);
    }
  }
  iVar1 = k + -1;
  if (0 < iVar3) {
    uVar5 = uVar5 + 1;
    do {
      rVar8 = stemp[uVar5 - 2];
      h[uVar5 - 2][iVar1] = rVar8;
      stemp[uVar5 - 1] = -rVar8;
      vtemp[uVar5 - 1] = v[uVar5 - 2];
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  *stemp = 1.0;
  p_Var4 = v[k];
  *vtemp = p_Var4;
  iVar2 = N_VLinearCombination(iVar3 + 1,stemp,vtemp,p_Var4);
  if (iVar2 == 0) {
    rVar8 = N_VDotProd(v[k],v[k]);
    dVar9 = 0.0;
    if (0.0 < rVar8) {
      rVar8 = N_VDotProd(v[k],v[k]);
      if (rVar8 < 0.0) {
        dVar9 = sqrt(rVar8);
      }
      else {
        dVar9 = SQRT(rVar8);
      }
    }
    *new_vk_norm = dVar9;
    if (dVar9 * 1000.0 < dVar11) {
      iVar3 = N_VDotProdMulti(iVar3,v[k],v + uVar7,stemp + 1);
      if (iVar3 != 0) goto LAB_004f24cf;
      *stemp = 1.0;
      p_Var4 = v[k];
      *vtemp = p_Var4;
      if ((int)uVar7 < k) {
        lVar6 = 0;
        do {
          h[uVar7 + lVar6][iVar1] = stemp[lVar6 + 1] + h[uVar7 + lVar6][iVar1];
          stemp[lVar6 + 1] = -stemp[lVar6 + 1];
          vtemp[lVar6 + 1] = v[lVar6];
          lVar6 = lVar6 + 1;
        } while ((uint)k - uVar7 != lVar6);
        p_Var4 = v[k];
      }
      iVar3 = N_VLinearCombination(k + 1,stemp,vtemp,p_Var4);
      if (iVar3 != 0) {
        return -1;
      }
      rVar8 = N_VDotProd(v[k],v[k]);
      rVar10 = 0.0;
      if (0.0 < rVar8) {
        rVar10 = N_VDotProd(v[k],v[k]);
        if (rVar10 < 0.0) {
          rVar10 = sqrt(rVar10);
        }
        else {
          rVar10 = SQRT(rVar10);
        }
      }
      *new_vk_norm = rVar10;
    }
    iVar3 = 0;
  }
  else {
LAB_004f24cf:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int SUNClassicalGS(N_Vector *v, realtype **h, int k, int p, realtype *new_vk_norm,
                   realtype *stemp, N_Vector *vtemp)
{
  int  i, i0, k_minus_1, retval;
  realtype vk_norm;

  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p,0);

  /* Perform Classical Gram-Schmidt */

  retval = N_VDotProdMulti(k-i0+1, v[k], v+i0, stemp);
  if (retval != 0) return(-1);

  vk_norm = SUNRsqrt(stemp[k-i0]);
  for (i=k-i0-1; i >= 0; i--) {
    h[i][k_minus_1] = stemp[i];
    stemp[i+1] = -stemp[i];
    vtemp[i+1] = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  retval = N_VLinearCombination(k-i0+1, stemp, vtemp, v[k]);
  if (retval != 0) return(-1);

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm) {

    retval = N_VDotProdMulti(k-i0, v[k], v+i0, stemp+1);
    if (retval != 0) return(-1);

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i=i0; i < k; i++) {
      h[i][k_minus_1] += stemp[i-i0+1];
      stemp[i-i0+1] = -stemp[i-i0+1];
      vtemp[i-i0+1] = v[i-i0];
    }

    retval = N_VLinearCombination(k+1, stemp, vtemp, v[k]);
    if (retval != 0) return(-1);

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  }

  return(0);
}